

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v2mplayer.cpp
# Opt level: O2

void anon_unknown.dwarf_22f9::UpdateSampleDelta
               (uint32_t nexttime,uint32_t time,uint32_t usecs,uint32_t td2,uint32_t *smplrem,
               uint32_t *smpldelta)

{
  uint uVar1;
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  uint32_t uVar4;
  
  auVar2._4_8_ = 0;
  auVar2._0_4_ = td2;
  auVar3._8_4_ = 0;
  auVar3._0_8_ = (ulong)usecs * (ulong)(nexttime - time);
  uVar1 = *smplrem;
  *smplrem = SUB124(auVar3 / auVar2,4) + uVar1;
  uVar4 = SUB124(auVar3 / auVar2,0) + *smpldelta;
  *smpldelta = uVar4;
  if (*smplrem < uVar1) {
    *smpldelta = uVar4 + 1;
  }
  return;
}

Assistant:

void UpdateSampleDelta(uint32_t nexttime, uint32_t time, uint32_t usecs, uint32_t td2, uint32_t *smplrem, uint32_t *smpldelta)
    {
        // performs 64bit (nexttime-time)*usecs/td2 and a 32.32bit addition to smpldelta:smplrem
        uint64_t t = ((nexttime - time) * (uint64_t) usecs) / td2;
        uint32_t r = *smplrem;
        *smplrem   += (t >> 32);        // bits 32-63
        *smpldelta += (t & 0xffffffff); // bits 00-31
        if (*smplrem < r)
        {
            *smpldelta += 1;
        }
    }